

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::DrawColumnAddPalCommand::Execute(DrawColumnAddPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  byte *pbVar10;
  uint uVar11;
  int iVar12;
  
  iVar9 = (this->super_PalColumnCommand).super_DrawerCommand._dest_y;
  iVar1 = *(int *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc;
  iVar12 = thread->pass_end_y - iVar9;
  if (iVar12 < 1) {
    iVar12 = 0;
  }
  if (iVar1 < iVar12) {
    iVar12 = iVar1;
  }
  uVar11 = thread->pass_start_y - iVar9;
  if ((int)uVar11 < 1) {
    uVar11 = 0;
  }
  iVar1 = thread->num_cores;
  iVar9 = (iVar1 - (int)((iVar9 + uVar11) - thread->core) % iVar1) % iVar1;
  uVar7 = (long)(int)((~uVar11 + iVar1 + iVar12) - iVar9) / (long)iVar1;
  uVar8 = uVar7 & 0xffffffff;
  if (0 < (int)uVar7) {
    iVar12 = (this->super_PalColumnCommand)._pitch;
    iVar9 = iVar9 + uVar11;
    pbVar10 = (this->super_PalColumnCommand)._dest + iVar12 * iVar9;
    iVar2 = (this->super_PalColumnCommand)._iscale;
    iVar9 = iVar9 * iVar2 + (this->super_PalColumnCommand)._texturefrac;
    puVar3 = (this->super_PalColumnCommand)._srcblend;
    puVar4 = (this->super_PalColumnCommand)._destblend;
    puVar5 = (this->super_PalColumnCommand)._colormap;
    puVar6 = (this->super_PalColumnCommand)._source;
    do {
      uVar11 = puVar4[*pbVar10] + puVar3[puVar5[puVar6[iVar9 >> 0x10]]] | 0x1f07c1f;
      *pbVar10 = RGB32k.All[uVar11 >> 0xf & uVar11];
      pbVar10 = pbVar10 + iVar12 * iVar1;
      iVar9 = iVar9 + iVar2 * iVar1;
      uVar11 = (int)uVar8 - 1;
      uVar8 = (ulong)uVar11;
    } while (uVar11 != 0);
  }
  return;
}

Assistant:

void DrawColumnAddPalCommand::Execute(DrawerThread *thread)
	{
		int count;
		uint8_t *dest;
		fixed_t frac;
		fixed_t fracstep;

		count = _count;
		dest = _dest;

		fracstep = _iscale;
		frac = _texturefrac;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;
		const uint8_t *colormap = _colormap;
		const uint8_t *source = _source;

		do
		{
			uint32_t fg = colormap[source[frac >> FRACBITS]];
			uint32_t bg = *dest;

			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg + bg) | 0x1f07c1f;
			*dest = RGB32k.All[fg & (fg >> 15)];
			dest += pitch;
			frac += fracstep;
		} while (--count);
	}